

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

void init_race_allocs(void)

{
  wchar_t wVar1;
  angband_constants *paVar2;
  short *p;
  void *p_00;
  alloc_entry *paVar3;
  short sVar4;
  short sVar5;
  wchar_t *pwVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ushort uVar10;
  long lVar11;
  int iVar12;
  
  p = (short *)mem_zalloc((ulong)((uint)z_info->max_depth * 2));
  p_00 = mem_zalloc((ulong)((uint)z_info->max_depth * 2));
  paVar2 = z_info;
  alloc_race_size = 0;
  uVar10 = z_info->r_max;
  if (uVar10 < 3) {
    sVar4 = 0;
  }
  else {
    pwVar6 = &r_info[1].rarity;
    lVar8 = 1;
    sVar4 = 0;
    do {
      if (*pwVar6 != L'\0') {
        sVar4 = sVar4 + 1;
        alloc_race_size = sVar4;
        p[pwVar6[-1]] = p[pwVar6[-1]] + 1;
        uVar10 = paVar2->r_max;
      }
      lVar8 = lVar8 + 1;
      pwVar6 = pwVar6 + 0x34;
    } while (lVar8 < (long)((ulong)uVar10 - 1));
  }
  if (1 < paVar2->max_depth) {
    sVar5 = *p;
    uVar9 = 1;
    do {
      sVar5 = sVar5 + p[uVar9];
      p[uVar9] = sVar5;
      uVar9 = uVar9 + 1;
    } while (uVar9 < paVar2->max_depth);
  }
  if (*p == 0) {
    quit("No town monsters!");
    sVar4 = alloc_race_size;
  }
  paVar3 = (alloc_entry *)mem_zalloc((long)sVar4 * 0x14);
  paVar2 = z_info;
  uVar10 = z_info->r_max;
  alloc_race_table = paVar3;
  if (2 < uVar10) {
    pwVar6 = &r_info[1].rarity;
    lVar8 = 1;
    do {
      if (*pwVar6 != L'\0') {
        wVar1 = pwVar6[-1];
        lVar11 = (long)wVar1;
        if (lVar11 < 1) {
          lVar7 = 0;
        }
        else {
          lVar7 = (long)p[lVar11 + -1];
        }
        iVar12 = (wVar1 / 10 + 1) * (int)(100 / (long)*pwVar6);
        sVar4 = *(short *)((long)p_00 + lVar11 * 2);
        paVar3[lVar7 + sVar4].index = (int)lVar8;
        paVar3[lVar7 + sVar4].level = wVar1;
        paVar3[lVar7 + sVar4].prob1 = iVar12;
        paVar3[lVar7 + sVar4].prob2 = iVar12;
        paVar3[lVar7 + sVar4].prob3 = iVar12;
        *(short *)((long)p_00 + lVar11 * 2) = sVar4 + 1;
        uVar10 = paVar2->r_max;
      }
      lVar8 = lVar8 + 1;
      pwVar6 = pwVar6 + 0x34;
    } while (lVar8 < (long)((ulong)uVar10 - 1));
  }
  mem_free(p_00);
  mem_free(p);
  return;
}

Assistant:

static void init_race_allocs(void) {
	int i;
	struct monster_race *race;
	alloc_entry *table;
	int16_t *num = mem_zalloc(z_info->max_depth * sizeof(int16_t));
	int16_t *already_counted =
		mem_zalloc(z_info->max_depth * sizeof(int16_t));

	/* Size of "alloc_race_table" */
	alloc_race_size = 0;

	/* Scan the monsters (not the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		/* Get the i'th race */
		race = &r_info[i];

		/* Legal monsters */
		if (race->rarity) {
			/* Count the entries */
			alloc_race_size++;

			/* Group by level */
			num[race->level]++;
		}
	}

	/* Calculate the cumultive level totals */
	for (i = 1; i < z_info->max_depth; i++) {
		/* Group by level */
		num[i] += num[i - 1];
	}

	/* Paranoia */
	if (!num[0]) quit("No town monsters!");

	/* Allocate the alloc_race_table */
	alloc_race_table = mem_zalloc(alloc_race_size * sizeof(alloc_entry));

	/* Get the table entry */
	table = alloc_race_table;

	/* Scan the monsters (not the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		/* Get the i'th race */
		race = &r_info[i];

		/* Count valid races */
		if (race->rarity) {
			int p, lev, prev_lev_count, race_index;

			/* Extract this race's level */
			lev = race->level;

			/* Extract the base probability */
			p = (100 / race->rarity);

			/* Multiply by depth factor (experimental) */
			p *= (1 + lev / 10);

			/* Skip entries preceding this monster's level */
			prev_lev_count = (lev > 0) ? num[lev - 1] : 0;

			/* Skip entries already counted for this level */
			race_index = prev_lev_count + already_counted[lev];

			/* Load the entry */
			table[race_index].index = i;
			table[race_index].level = lev;
			table[race_index].prob1 = p;
			table[race_index].prob2 = p;
			table[race_index].prob3 = p;

			/* Another entry complete for this locale */
			already_counted[lev]++;
		}
	}
	mem_free(already_counted);
	mem_free(num);
}